

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  int iVar1;
  sqlite_int64 *pRowid_local;
  sqlite3_value **apVal_local;
  int nArg_local;
  sqlite3_vtab *pVtab_local;
  
  iVar1 = sqlite3Fts3UpdateMethod(pVtab,nArg,apVal,pRowid);
  return iVar1;
}

Assistant:

static int fts3UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  return sqlite3Fts3UpdateMethod(pVtab, nArg, apVal, pRowid);
}